

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test7(StringTest *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  allocator<char> local_89;
  string local_88 [8];
  string t3;
  string t2;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string t1;
  StringTest *this_local;
  
  t1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"Hello World, this is a string",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)(t3.field_2._M_local_buf + 8),(string *)local_30);
  std::__cxx11::string::erase((ulong)local_30,0xb);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello World this is a string");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World, this is a string"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x163,"Error on erase");
  }
  uVar2 = std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)local_30,uVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello World this is a string");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World, this is a string"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x168,"Error on erase");
  }
  lVar3 = std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)local_30,lVar3 - 1);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello World this is a strin");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World, this is a string"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x177,"Error on erase");
  }
  std::__cxx11::string::erase((ulong)local_30,0);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"llo World this is a strin");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World, this is a string"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x17c,"Error on erase");
  }
  std::__cxx11::string::erase((ulong)local_30,0);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World, this is a string"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x181,"Error on erase");
  }
  std::__cxx11::string::operator=((string *)local_30,"Hello World");
  std::__cxx11::string::operator=((string *)(t3.field_2._M_local_buf + 8),(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"to the ",&local_89);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::insert((ulong)local_30,(string *)0x6);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x18e,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)local_30,(string *)0x6,(ulong)local_88,3);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello the to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x195,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)local_30,(char *)0xa);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello the matador to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x19c,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)local_30,5,'\x01');
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello, the matador to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1a3,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)local_30,0x12,'\x03');
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello, the matador!!! to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1aa,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)local_30,(char *)0x16,0x10b5e5);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Hello, the matador!!! welcome to the World");
  if ((bVar1) ||
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&t3.field_2 + 8),"Hello World"), bVar1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1b1,"Error on insert");
  }
  std::__cxx11::string::replace((ulong)local_30,0,(string *)0x7);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"to the the matador!!! welcome to the World");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1ba,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)local_30,0xb,(string *)0xa,(ulong)local_88,3);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"to the the the welcome to the World");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1c1,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)local_30,0xf,(char *)0x8,0x10b67f);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"to the the the the to the World");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1c8,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)local_30,0x1a,(char *)0x5);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"to the the the the to the the end");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1cf,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)local_30,2,0x17,'\x03');
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"to... the end");
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1d6,"Error on replace");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)(t3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Test7()
	{
		// erase, insert, replace

		string t1 = "Hello World, this is a string";
		string t2 = t1;
		
		t1.erase( 11, 1 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );
		
		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase( t1.length(), 1 );

		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

#ifdef USE_JH_STRING		
		t1.erase( t1.length() + 1, 1 );

		LOG_NOTICE( "string is %s", t1.c_str() );
		LOG_NOTICE( "string is t2 %s", t2.c_str() );
		
		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );
#endif

		t1.erase( t1.length() - 1, 2 );

		if ( t1 != "Hello World this is a strin" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase( 0, 2 );

		if ( t1 != "llo World this is a strin" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase();

		if ( t1 != "" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );
		
		t1 = "Hello World";
		t2 = t1;
		string t3 = "to the ";
		
		LOG_NOTICE( "starting insert tests" );
		
		t1.insert( 6, t3 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 6, t3, 3, 4 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello the to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 10, "matador " );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello the matador to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 5, 1, ',' );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 18, 3, '!' );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador!!! to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 22, "welcome my son", 8 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador!!! welcome to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );
		
		LOG_NOTICE( "starting replace tests" );

		t1.replace( 0, 7, t3 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the matador!!! welcome to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 11, 10, t3, 3, 3 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the welcome to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 15, 8, "the world", 4 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the the to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 26, 5, "the end" );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the the to the the end" )
			TestFailed( "Error on replace" );

		t1.replace( 2, 23, 3, '.' );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to... the end" )
			TestFailed( "Error on replace" );
		
		TestPassed();
	}